

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaWriteAig.c
# Opt level: O2

char * Ioa_WriteAigerIntoMemory(Aig_Man_t *pMan,int *pnSize)

{
  char *pcVar1;
  Vec_Str_t *p;
  
  p = Ioa_WriteAigerIntoMemoryStr(pMan);
  if (pMan->pName != (char *)0x0) {
    Vec_StrPrintStr(p,"n");
    Vec_StrPrintStr(p,pMan->pName);
    Vec_StrPush(p,'\0');
  }
  *pnSize = p->nSize;
  pcVar1 = p->pArray;
  p->nCap = 0;
  p->nSize = 0;
  p->pArray = (char *)0x0;
  Vec_StrFree(p);
  return pcVar1;
}

Assistant:

char * Ioa_WriteAigerIntoMemory( Aig_Man_t * pMan, int * pnSize )
{
    char * pBuffer;
    Vec_Str_t * vBuffer;
    vBuffer = Ioa_WriteAigerIntoMemoryStr( pMan );
    if ( pMan->pName )
    {
        Vec_StrPrintStr( vBuffer, "n" );
        Vec_StrPrintStr( vBuffer, pMan->pName );
        Vec_StrPush( vBuffer, 0 );
    }
    // prepare the return values
    *pnSize = Vec_StrSize( vBuffer );
    pBuffer = Vec_StrReleaseArray( vBuffer );
    Vec_StrFree( vBuffer );
    return pBuffer;
}